

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

void slang::SourceManager::computeLineOffsets
               (SmallVector<char,_40UL> *buffer,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets)

{
  char cVar1;
  char cVar2;
  iterator iVar3;
  size_type sVar4;
  char *pcVar5;
  char *pcVar6;
  unsigned_long local_30;
  
  local_30 = 0;
  iVar3._M_current =
       (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (offsets,iVar3,&local_30);
  }
  else {
    *iVar3._M_current = 0;
    (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  sVar4 = (buffer->super_SmallVectorBase<char>).len;
  if (sVar4 != 0) {
    pcVar6 = (buffer->super_SmallVectorBase<char>).data_;
    pcVar5 = pcVar6 + sVar4;
    do {
      cVar1 = *pcVar6;
      if ((cVar1 == '\r') || (cVar1 == '\n')) {
        cVar2 = pcVar6[1];
        if (((cVar2 == '\r') || (cVar2 == '\n')) && (cVar1 != cVar2)) {
          pcVar6 = pcVar6 + 1;
        }
        pcVar6 = pcVar6 + 1;
        local_30 = (long)pcVar6 - (long)(buffer->super_SmallVectorBase<char>).data_;
        iVar3._M_current =
             (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(offsets,iVar3,&local_30);
        }
        else {
          *iVar3._M_current = local_30;
          (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      else {
        pcVar6 = pcVar6 + 1;
      }
    } while (pcVar6 != pcVar5);
  }
  return;
}

Assistant:

void SourceManager::computeLineOffsets(const SmallVector<char>& buffer,
                                       std::vector<size_t>& offsets) noexcept {
    // first line always starts at offset 0
    offsets.push_back(0);

    const char* ptr = buffer.data();
    const char* end = buffer.data() + buffer.size();
    while (ptr != end) {
        if (ptr[0] == '\n' || ptr[0] == '\r') {
            // if we see \r\n or \n\r skip both chars
            if ((ptr[1] == '\n' || ptr[1] == '\r') && ptr[0] != ptr[1])
                ptr++;
            ptr++;
            offsets.push_back((size_t)(ptr - buffer.data()));
        }
        else {
            ptr++;
        }
    }
}